

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

int main(void)

{
  char cVar1;
  reference pvVar2;
  const_iterator __first;
  const_iterator __last;
  unsigned_long uVar3;
  size_t count;
  size_t i_1;
  ulong uStack_f0;
  char c;
  size_t i;
  size_t length;
  array<unsigned_long,_26UL> histogram;
  
  histogram._M_elems[0x19]._4_4_ = 0;
  memset(&length,0,0xd0);
  for (uStack_f0 = 0; uStack_f0 < 0x4f92e; uStack_f0 = uStack_f0 + 1) {
    cVar1 = anon_var_dwarf_4dc[uStack_f0];
    if ((cVar1 < 'a') || ('z' < cVar1)) {
      if (('@' < cVar1) && (cVar1 < '[')) {
        pvVar2 = std::array<unsigned_long,_26UL>::operator[]
                           ((array<unsigned_long,_26UL> *)&length,(long)(cVar1 + -0x41));
        *pvVar2 = *pvVar2 + 1;
      }
    }
    else {
      pvVar2 = std::array<unsigned_long,_26UL>::operator[]
                         ((array<unsigned_long,_26UL> *)&length,(long)(cVar1 + -0x61));
      *pvVar2 = *pvVar2 + 1;
    }
  }
  printf("Characters in \'On Liberty\':\n");
  for (count = 0; count < 0x1a; count = count + 1) {
    pvVar2 = std::array<unsigned_long,_26UL>::operator[]
                       ((array<unsigned_long,_26UL> *)&length,count);
    printf("%c: %zu\n",(ulong)(uint)(int)(char)((char)count + 'a'),*pvVar2);
  }
  __first = std::array<unsigned_long,_26UL>::cbegin((array<unsigned_long,_26UL> *)&length);
  __last = std::array<unsigned_long,_26UL>::cend((array<unsigned_long,_26UL> *)&length);
  uVar3 = std::accumulate<unsigned_long_const*,unsigned_long>(__first,__last,0);
  printf("other: %zu\n",0x4f92e - uVar3);
  return histogram._M_elems[0x19]._4_4_;
}

Assistant:

int main() {
  std::array<size_t, 26> histogram = {};
  size_t length = k_books_on_liberty_txt_len;
  for (size_t i = 0; i < length; ++i) {
    char c = k_books_on_liberty_txt[i];
    if ('a' <= c && c <= 'z') {
      histogram[c-'a']++;
    } else if ('A' <= c && c <= 'Z') {
      histogram[c-'A']++;
    }
  }
  printf("Characters in 'On Liberty':\n");
  for (size_t i = 0; i < 26; ++i) {
    printf("%c: %zu\n", char('a'+i), histogram[i]);
  }
  size_t count = std::accumulate(histogram.cbegin(), histogram.cend(), size_t());
  printf("other: %zu\n", length - count);
}